

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall VmaBlockVector::PrintDetailedMap(VmaBlockVector *this,VmaJsonWriter *json)

{
  bool bVar1;
  size_t i;
  ulong uVar2;
  VmaMutexLockRead lock;
  VmaMutexLockRead local_28;
  
  bVar1 = this->m_hAllocator->m_UseMutex;
  local_28.m_pMutex = (VmaRWMutex *)0x0;
  if (bVar1 != false) {
    local_28.m_pMutex = &this->m_Mutex;
  }
  if (bVar1 == true) {
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&this->m_Mutex);
  }
  VmaJsonWriter::BeginObject(json,false);
  for (uVar2 = 0; uVar2 < (this->m_Blocks).m_Count; uVar2 = uVar2 + 1) {
    VmaJsonWriter::BeginString(json,(char *)0x0);
    VmaJsonWriter::ContinueString(json,(this->m_Blocks).m_pArray[uVar2]->m_Id);
    VmaJsonWriter::EndString(json,(char *)0x0);
    VmaJsonWriter::BeginObject(json,false);
    VmaJsonWriter::WriteString(json,"MapRefCount");
    VmaJsonWriter::WriteNumber(json,(this->m_Blocks).m_pArray[uVar2]->m_MapCount);
    (*(this->m_Blocks).m_pArray[uVar2]->m_pMetadata->_vptr_VmaBlockMetadata[0x10])();
    VmaJsonWriter::EndObject(json);
  }
  VmaJsonWriter::EndObject(json);
  VmaMutexLockRead::~VmaMutexLockRead(&local_28);
  return;
}

Assistant:

void VmaBlockVector::PrintDetailedMap(class VmaJsonWriter& json)
{
    VmaMutexLockRead lock(m_Mutex, m_hAllocator->m_UseMutex);


    json.BeginObject();
    for (size_t i = 0; i < m_Blocks.size(); ++i)
    {
        json.BeginString();
        json.ContinueString(m_Blocks[i]->GetId());
        json.EndString();

        json.BeginObject();
        json.WriteString("MapRefCount");
        json.WriteNumber(m_Blocks[i]->GetMapRefCount());

        m_Blocks[i]->m_pMetadata->PrintDetailedMap(json);
        json.EndObject();
    }
    json.EndObject();
}